

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O2

size_t nivalis::detail::print_ast(ostream *os,AST *ast,Environment *env,size_t idx)

{
  char cVar1;
  uint uVar2;
  pointer pAVar3;
  char *pcVar4;
  ostream *poVar5;
  size_t sVar6;
  const_reference pvVar7;
  size_t idx_00;
  size_t i;
  ulong uVar8;
  char *pcVar9;
  size_t sVar10;
  
  pcVar4 = OpCode::repr((ast->
                        super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                        )._M_impl.super__Vector_impl_data._M_start[idx].opcode);
  idx_00 = idx + 1;
  pAVar3 = (ast->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pAVar3[idx].opcode == 0xc) {
    if (env == (Environment *)0x0) {
      poVar5 = std::operator<<(os,"<function id=");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5,", ");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      pcVar4 = " args>(";
    }
    else {
      poVar5 = std::operator<<(os,(string *)
                                  ((env->funcs).
                                   super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                                  pAVar3[idx].field_1.call_info[0]));
      pcVar4 = "(";
    }
    std::operator<<(poVar5,pcVar4);
    uVar2 = (ast->
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
            _M_impl.super__Vector_impl_data._M_start[idx].field_1.call_info[1];
    for (uVar8 = 0; uVar2 != uVar8; uVar8 = uVar8 + 1) {
      if (uVar8 != 0) {
        std::operator<<(os,", ");
      }
      idx_00 = print_ast(os,ast,env,idx_00);
    }
    std::operator<<(os,")");
  }
  else {
    sVar6 = strlen(pcVar4);
    for (sVar10 = 0; sVar6 != sVar10; sVar10 = sVar10 + 1) {
      cVar1 = pcVar4[sVar10];
      if (cVar1 != '\t') {
        if (cVar1 == '\v') {
          std::ostream::_M_insert<double>
                    ((ast->
                     super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                     )._M_impl.super__Vector_impl_data._M_start[idx].field_1.val);
        }
        else if (cVar1 == '\r') {
          if (env == (Environment *)0x0) {
            pcVar9 = "@";
            goto LAB_001110e9;
          }
          uVar8 = (ast->
                  super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                  )._M_impl.super__Vector_impl_data._M_start[idx].field_1.ref;
          if (uVar8 < (ulong)((long)(env->vars).super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)(env->vars).super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3)) {
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::at(&env->varname,uVar8);
            std::operator<<(os,(string *)pvVar7);
          }
          else {
            std::operator<<(os,"&NULL");
          }
        }
        else if (cVar1 == '$') {
          pcVar9 = "$";
LAB_001110e9:
          poVar5 = std::operator<<(os,pcVar9);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        }
        else if (cVar1 == '@') {
          idx_00 = print_ast(os,ast,env,idx_00);
        }
        else {
          std::operator<<(os,cVar1);
        }
      }
    }
  }
  return idx_00;
}

Assistant:

size_t print_ast(std::ostream& os, const Expr::AST& ast,
               const Environment* env, size_t idx) {
    std::string_view reprs = OpCode::repr(ast[idx].opcode);
    size_t n_idx = idx + 1;
    if (ast[idx].opcode == OpCode::call) {
        // Special handling for user function
        if (env != nullptr) {
            os << env->funcs[ast[idx].call_info[0]].name << "(";
        } else {
            os << "<function id=" << ast[idx].call_info[0] << ", " << ast[idx].call_info[1] << " args>(";
        }
        size_t n_args = ast[idx].call_info[1];
        for (size_t i = 0; i < n_args; ++i) {
            if (i) os << ", ";
            n_idx = print_ast(os, ast, env, n_idx);
        }
        os << ")";
    } else {
        for (char c : reprs) {
            switch(c) {
                case '@': n_idx = print_ast(os, ast, env, n_idx); break; // subexpr
                case '\v': os << ast[idx].val; break; // value
                case '\r':
                          if (env != nullptr) {
                              if (ast[idx].ref >= env->vars.size()) {
                                  os << "&NULL";
                                  break;
                              } os << env->varname.at(ast[idx].ref);
                          }
                          else os << "@" << ast[idx].ref;
                          break; // ref
                case '\t':
                          // Not used
                          break;
                case '$':
                          os << "$" << ast[idx].ref;
                          break;
                default: os << c;
            }
        }
    }
    return n_idx;
}